

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
TransformPromiseNode<kj::HttpClient::WebSocketResponse,_kj::HttpClient::Response,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:3355:22),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::HttpClient::WebSocketResponse,_kj::HttpClient::Response,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:3355:22),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::HttpClient::Response> *this_00;
  ExceptionOr<kj::HttpClient::Response> depResult;
  undefined1 local_608 [40];
  anon_union_16_2_a774ebf0_for_OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_>_3
  local_5e0;
  ArrayDisposer *local_5d0;
  Disposer *pDStack_5c8;
  Context *local_5c0;
  undefined1 local_5b8 [264];
  ExceptionOr<kj::HttpClient::Response> local_4b0;
  ExceptionOr<kj::HttpClient::WebSocketResponse> local_318;
  undefined1 local_178 [40];
  char *local_150;
  size_t sStack_148;
  ArrayDisposer *local_140;
  Disposer *pDStack_138;
  Context *local_130;
  undefined1 local_128 [272];
  
  this_00 = &local_4b0;
  local_4b0.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_4b0.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&this_00->super_ExceptionOrValue);
  if (local_4b0.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::Exception
              ((Exception *)local_178,&local_4b0.super_ExceptionOrValue.exception.ptr.field_1.value)
    ;
    local_608._0_8_ = local_178._0_8_;
    local_608._8_8_ = local_178._8_8_;
    local_608._16_8_ = local_178._16_8_;
    local_178._0_8_ = (char *)0x0;
    local_178._8_8_ = (char *)0x0;
    local_608._24_8_ = local_178._24_8_;
    local_608._32_8_ = local_178._32_8_;
    local_5e0.forceAligned = local_150;
    local_5e0._8_8_ = sStack_148;
    local_150 = (char *)0x0;
    sStack_148 = 0;
    local_5d0 = local_140;
    pDStack_5c8 = pDStack_138;
    local_5c0 = local_130;
    local_130 = (Context *)0x0;
    memcpy(local_5b8,local_128,0x104);
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_318,(Exception *)local_608);
    local_318.value.ptr.isSet = false;
    Exception::~Exception((Exception *)local_608);
    ExceptionOr<kj::HttpClient::WebSocketResponse>::operator=
              ((ExceptionOr<kj::HttpClient::WebSocketResponse> *)output,&local_318);
    ExceptionOr<kj::HttpClient::WebSocketResponse>::~ExceptionOr(&local_318);
    Exception::~Exception((Exception *)local_178);
  }
  else if (local_4b0.value.ptr.isSet == true) {
    anon_class_1_0_00000001_for_func::operator()
              ((WebSocketResponse *)local_608,(anon_class_1_0_00000001_for_func *)this_00,
               &local_4b0.value.ptr.field_1.value);
    ExceptionOr<kj::HttpClient::WebSocketResponse>::ExceptionOr
              (&local_318,(WebSocketResponse *)local_608);
    ExceptionOr<kj::HttpClient::WebSocketResponse>::operator=
              ((ExceptionOr<kj::HttpClient::WebSocketResponse> *)output,&local_318);
    ExceptionOr<kj::HttpClient::WebSocketResponse>::~ExceptionOr(&local_318);
    OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_>::~OneOf
              ((OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_> *)(local_608 + 0x20));
  }
  ExceptionOr<kj::HttpClient::Response>::~ExceptionOr(&local_4b0);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }